

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_size_format(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  char *zString;
  jx9_value *pjVar7;
  int iVar8;
  
  if (nArg < 1) {
    pjVar7 = pCtx->pRet;
    zString = "";
    iVar2 = 0;
  }
  else {
    pjVar7 = *apArg;
    jx9MemObjToInteger(pjVar7);
    pvVar1 = (pjVar7->x).pOther;
    if (99 < (long)pvVar1) {
      iVar2 = 0;
      do {
        iVar8 = iVar2;
        pvVar5 = pvVar1;
        iVar2 = iVar8 + 1;
        pvVar1 = (void *)((ulong)pvVar5 >> 10);
      } while ((void *)0xfffff < pvVar5);
      uVar3 = ((uint)pvVar5 & 0x3fc) / 100;
      uVar4 = (ulong)uVar3;
      if (8 < (ushort)uVar3) {
        uVar4 = 9;
      }
      if ((void *)0xf9fff < pvVar5) {
        uVar4 = 9;
        iVar8 = iVar2;
      }
      uVar6 = (ulong)pvVar5 >> 10 & 0xffffffff;
      if ((void *)0xf9fff < pvVar5) {
        uVar6 = 0;
      }
      jx9_result_string_format(pCtx,"%d.%d %cB",uVar6,uVar4,(ulong)(uint)(int)"KMGTPEZ"[iVar8]);
      return 0;
    }
    pjVar7 = pCtx->pRet;
    zString = "0.1 KB";
    iVar2 = 6;
  }
  jx9_value_string(pjVar7,zString,iVar2);
  return 0;
}

Assistant:

static int jx9Builtin_size_format(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	/*Kilo*/ /*Mega*/ /*Giga*/ /*Tera*/ /*Peta*/ /*Exa*/ /*Zeta*/
	static const char zUnit[] = {"KMGTPEZ"};
	sxi32 nRest, i_32;
	jx9_int64 iSize;
	int c = -1; /* index in zUnit[] */

	if( nArg < 1 ){
		/* Missing argument, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the given size */
	iSize = jx9_value_to_int64(apArg[0]);
	if( iSize < 100 /* Bytes */ ){
		/* Don't bother formatting, return immediately */
		jx9_result_string(pCtx, "0.1 KB", (int)sizeof("0.1 KB")-1);
		return JX9_OK;
	}
	for(;;){
		nRest = (sxi32)(iSize & 0x3FF); 
		iSize >>= 10;
		c++;
		if( (iSize & (~0 ^ 1023)) == 0 ){
			break;
		}
	}
	nRest /= 100;
	if( nRest > 9 ){
		nRest = 9;
	}
	if( iSize > 999 ){
		c++;
		nRest = 9;
		iSize = 0;
	}
	i_32 = (sxi32)iSize;
	/* Format */
	jx9_result_string_format(pCtx, "%d.%d %cB", i_32, nRest, zUnit[c]);
	return JX9_OK;
}